

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DiagObjectModel.cpp
# Opt level: O2

bool __thiscall Js::RecyclableObjectDisplay::IsLiteralProperty(RecyclableObjectDisplay *this)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  PropertyRecord *pPVar4;
  CharClassifier *pCVar5;
  OLECHAR *pOVar6;
  
  if (this->scriptContext == (ScriptContext *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Debug/DiagObjectModel.cpp"
                                ,0x769,"(this->scriptContext)","this->scriptContext");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  if (this->propertyId == -1) {
    bVar2 = true;
  }
  else {
    pPVar4 = ThreadContext::GetPropertyName(this->scriptContext->threadContext,this->propertyId);
    pCVar5 = ScriptContext::GetCharClassifier(this->scriptContext);
    pOVar6 = (*pCVar5->skipIdentifierFunc)((LPCOLESTR)(pPVar4 + 1),pCVar5);
    bVar2 = pPVar4->byteCount >> 1 == (uint)((ulong)((long)pOVar6 - (long)(pPVar4 + 1)) >> 1);
  }
  return bVar2;
}

Assistant:

bool RecyclableObjectDisplay::IsLiteralProperty() const
    {
        Assert(this->scriptContext);

        if (this->propertyId != Constants::NoProperty)
        {
            Js::PropertyRecord const * propertyRecord = this->scriptContext->GetThreadContext()->GetPropertyName(this->propertyId);
            const WCHAR* startOfPropertyName = propertyRecord->GetBuffer();
            const WCHAR* endOfIdentifier = this->scriptContext->GetCharClassifier()->SkipIdentifier((LPCOLESTR)propertyRecord->GetBuffer());
            return (charcount_t)(endOfIdentifier - startOfPropertyName) == propertyRecord->GetLength();
        }
        else
        {
            return true;
        }
    }